

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(ArenaStringPtr *this)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &psVar2->field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(psVar2);
  return;
}

Assistant:

void ArenaStringPtr::DestroyNoArenaSlowPath() { delete UnsafeMutablePointer(); }